

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::ArrayIteratorPrototypeHasUserDefinedNext(ScriptContext *scriptContext)

{
  DisableImplicitFlags DVar1;
  ImplicitCallFlags IVar2;
  ImplicitCallFlags IVar3;
  ThreadContext *pTVar4;
  JavascriptFunction *pJVar5;
  bool bVar6;
  
  pTVar4 = scriptContext->threadContext;
  DVar1 = pTVar4->disableImplicitFlags;
  IVar2 = pTVar4->implicitCallFlags;
  pTVar4->disableImplicitFlags = DVar1 | DisableImplicitCallFlag;
  pTVar4->implicitCallFlags = ImplicitCall_None;
  pJVar5 = (JavascriptFunction *)
           JavascriptOperators::GetPropertyNoCache
                     (&((((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                        super_JavascriptLibraryBase).arrayIteratorPrototype.ptr)->
                       super_RecyclableObject,0x107,scriptContext);
  IVar3 = pTVar4->implicitCallFlags;
  pTVar4->disableImplicitFlags = DVar1;
  pTVar4->implicitCallFlags = IVar2;
  bVar6 = true;
  if (IVar3 == ImplicitCall_None) {
    bVar6 = pJVar5 != (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                      super_JavascriptLibraryBase).arrayIteratorPrototypeBuiltinNextFunction.ptr;
  }
  return bVar6;
}

Assistant:

bool JavascriptLibrary::ArrayIteratorPrototypeHasUserDefinedNext(ScriptContext *scriptContext)
    {
        Var arrayIteratorPrototypeNext = nullptr;
        ImplicitCallFlags flags = scriptContext->GetThreadContext()->TryWithDisabledImplicitCall(
                [&]() { arrayIteratorPrototypeNext = JavascriptOperators::GetPropertyNoCache(scriptContext->GetLibrary()->GetArrayIteratorPrototype(), PropertyIds::next, scriptContext); });

        return (flags != ImplicitCall_None) || arrayIteratorPrototypeNext != scriptContext->GetLibrary()->GetArrayIteratorPrototypeBuiltinNextFunction();
    }